

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseSuffixForFloatLiteral
          (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this)

{
  bool bVar1;
  char *pcVar2;
  UTF8Reader *this_00;
  
  this_00 = &this->input;
  bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*>(this_00,"f32i","_f32i","fi");
  if (bVar1) {
    pcVar2 = "$imag32";
  }
  else {
    bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*>(this_00,"f64i","_f64i","i");
    if (bVar1) {
      pcVar2 = "$imag64";
    }
    else {
      bVar1 = UTF8Reader::advanceIfStartsWith<char_const*>(this_00,"f64","_f64");
      if (bVar1) {
        pcVar2 = "$float64";
      }
      else {
        bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*,char_const*>
                          (this_00,"f32","_f32","f","_f");
        pcVar2 = "$float64";
        if (bVar1) {
          pcVar2 = "$float32";
        }
      }
    }
  }
  return (TokenType)pcVar2;
}

Assistant:

TokenType parseSuffixForFloatLiteral()
    {
        if (input.advanceIfStartsWith ("f32i", "_f32i", "fi"))    return Token::literalImag32;
        if (input.advanceIfStartsWith ("f64i", "_f64i", "i"))     return Token::literalImag64;
        if (input.advanceIfStartsWith ("f64", "_f64"))            return Token::literalFloat64;
        if (input.advanceIfStartsWith ("f32", "_f32", "f", "_f")) return Token::literalFloat32;

        return Token::literalFloat64;
    }